

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

void __thiscall asmjit::v1_14::BaseEmitter::BaseEmitter(BaseEmitter *this,EmitterType emitterType)

{
  undefined1 in_SIL;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__BaseEmitter_002252a8;
  *(undefined1 *)(in_RDI + 1) = in_SIL;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0xb) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  in_RDI[3] = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = 1;
  *(undefined4 *)(in_RDI + 5) = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  memset(in_RDI + 9,0,8);
  *(undefined1 *)(in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 0x49) = 0;
  *(undefined1 *)((long)in_RDI + 0x4a) = 0;
  *(undefined1 *)((long)in_RDI + 0x4b) = 0;
  *(undefined1 *)((long)in_RDI + 0x4c) = 0;
  *(undefined1 *)((long)in_RDI + 0x4d) = 0;
  *(undefined1 *)((long)in_RDI + 0x4e) = 0;
  *(undefined1 *)((long)in_RDI + 0x4f) = 0;
  *(undefined4 *)(in_RDI + 10) = 0;
  *(undefined4 *)((long)in_RDI + 0x54) = 0;
  *(undefined4 *)(in_RDI + 0xb) = 0;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  return;
}

Assistant:

BaseEmitter::~BaseEmitter() noexcept {
  if (_code) {
    _addEmitterFlags(EmitterFlags::kDestroyed);
    _code->detach(this);
  }
}